

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall level_mesh::setup_collision_models(level_mesh *this,b_submesh_vec *submeshes)

{
  undefined8 uVar1;
  bool bVar2;
  reference ppbVar3;
  MeshInterface *pMVar4;
  const_reference pvVar5;
  Point *pPVar6;
  IndexedTriangle *tris;
  size_type sVar7;
  iterator iVar8;
  iterator iVar9;
  undefined1 auStack_80 [4];
  BOOL status;
  OPCODECREATE opcc;
  b_submesh *sm;
  b_submesh_vec_it end;
  b_submesh_vec_it it;
  b_submesh_vec *submeshes_local;
  level_mesh *this_local;
  
  end._M_current =
       (b_submesh **)std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::begin(submeshes);
  sm = (b_submesh *)std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::end(submeshes);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
                             *)&sm);
    if (!bVar2) {
      iVar8 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::begin(submeshes);
      iVar9 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::end(submeshes);
      std::
      sort<__gnu_cxx::__normal_iterator<b_submesh**,std::vector<b_submesh*,std::allocator<b_submesh*>>>,x1_pred>
                (iVar8._M_current,iVar9._M_current);
      return;
    }
    ppbVar3 = __gnu_cxx::
              __normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
              ::operator*(&end);
    opcc._16_8_ = *ppbVar3;
    if ((((b_submesh *)opcc._16_8_)->opc_mesh).mTris == (IndexedTriangle *)0x0) {
      if ((((b_submesh *)opcc._16_8_)->super_b_model_instance).num_faces < 2) {
        pvVar5 = std::
                 vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ::operator[](&(this->super_xr_mesh_builder).m_faces,
                              (ulong)(((b_submesh *)opcc._16_8_)->super_b_model_instance).min_face);
        *(undefined8 *)(opcc._16_8_ + 200) = *(undefined8 *)&pvVar5->field_0;
        *(uint32_t *)(opcc._16_8_ + 0xd0) = (pvVar5->field_0).field_0.v[2];
        *(undefined8 *)(opcc._16_8_ + 0xd4) = *(undefined8 *)(opcc._16_8_ + 200);
        *(undefined4 *)(opcc._16_8_ + 0xdc) = *(undefined4 *)(opcc._16_8_ + 0xd0);
        *(undefined4 *)(opcc._16_8_ + 0x80) = 2;
        Opcode::MeshInterface::SetStrides((MeshInterface *)(opcc._16_8_ + 0x80),0xc,0xc);
        pMVar4 = (MeshInterface *)(opcc._16_8_ + 0x80);
        tris = (IndexedTriangle *)(opcc._16_8_ + 200);
        pPVar6 = (Point *)std::
                          vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                          ::operator[](&this->m_fat_points,0);
        Opcode::MeshInterface::SetPointers(pMVar4,tris,pPVar6);
      }
      else {
        (((b_submesh *)opcc._16_8_)->opc_mesh).mNbTris =
             (udword)(((b_submesh *)opcc._16_8_)->super_b_model_instance).num_faces;
        Opcode::MeshInterface::SetStrides(&((b_submesh *)opcc._16_8_)->opc_mesh,0x40,0xc);
        pMVar4 = (MeshInterface *)(opcc._16_8_ + 0x80);
        pvVar5 = std::
                 vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ::operator[](&(this->super_xr_mesh_builder).m_faces,
                              (ulong)*(uint *)(opcc._16_8_ + 0x18));
        pPVar6 = (Point *)std::
                          vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                          ::operator[](&this->m_fat_points,0);
        Opcode::MeshInterface::SetPointers(pMVar4,(IndexedTriangle *)pvVar5,pPVar6);
      }
      uVar1 = opcc._16_8_;
      sVar7 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
              size(&(this->super_xr_mesh_builder).super_xr_mesh.m_points);
      *(int *)(uVar1 + 0x84) = (int)sVar7;
      Opcode::OPCODECREATE::OPCODECREATE((OPCODECREATE *)auStack_80);
      _auStack_80 = (MeshInterface *)(opcc._16_8_ + 0x80);
      bVar2 = Opcode::Model::Build((Model *)(opcc._16_8_ + 0xa0),(OPCODECREATE *)auStack_80);
      if (!bVar2) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                      ,0x15c,"void level_mesh::setup_collision_models(b_submesh_vec &) const");
      }
    }
    __gnu_cxx::
    __normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>::
    operator++(&end);
  } while( true );
}

Assistant:

void level_mesh::setup_collision_models(b_submesh_vec& submeshes) const
{
	for (b_submesh_vec_it it = submeshes.begin(), end = submeshes.end(); it != end; ++it) {
		b_submesh* sm = *it;
		if (sm->opc_mesh.GetTris() != null)
			continue;
		if (sm->num_faces > 1) {
			sm->opc_mesh.SetNbTriangles(udword(sm->num_faces & UINT32_MAX));
			sm->opc_mesh.SetStrides(sizeof(b_face), sizeof(fvector3));
			sm->opc_mesh.SetPointers((IndexedTriangle*)&m_faces[sm->min_face],
					(Point*)&m_fat_points[0]);
		} else {
			// FIXME: hack to handle 1-face meshes
			sm->opc_hack[1] = sm->opc_hack[0] = *(IndexedTriangle*)m_faces[sm->min_face].v;
			sm->opc_mesh.SetNbTriangles(2);
			sm->opc_mesh.SetStrides(sizeof(IndexedTriangle), sizeof(fvector3));
			sm->opc_mesh.SetPointers(sm->opc_hack, (Point*)&m_fat_points[0]);
		}
		sm->opc_mesh.SetNbVertices(udword(m_points.size() & UINT32_MAX));
		OPCODECREATE opcc;
		opcc.mIMesh = &sm->opc_mesh;
		BOOL status = sm->opc_model.Build(opcc);
		xr_assert(status);
	}
	std::sort(submeshes.begin(), submeshes.end(), x1_pred());
}